

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFiltersExport.cpp
# Opt level: O2

char * helicsFilterGetInfo(HelicsFilter filt)

{
  string *psVar1;
  
  if ((filt == (HelicsFilter)0x0) || (*(int *)((long)filt + 4) != -0x13d9fed9)) {
    psVar1 = &gHelicsEmptyStr_abi_cxx11_;
  }
  else {
    psVar1 = helics::Interface::getInfo_abi_cxx11_(*(Interface **)((long)filt + 8));
  }
  return (psVar1->_M_dataplus)._M_p;
}

Assistant:

helics::FilterObject* getFilterObj(HelicsFilter filt, HelicsError* err)
{
    HELICS_ERROR_CHECK(err, nullptr);
    if (filt == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidFilterString);
        return nullptr;
    }
    auto* fObj = reinterpret_cast<helics::FilterObject*>(filt);
    if (fObj->valid != filterValidationIdentifier) {
        assignError(err, HELICS_ERROR_INVALID_OBJECT, invalidFilterString);
        return nullptr;
    }
    return fObj;
}